

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minmaxStep(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int iVar1;
  uint uVar2;
  CollSeq *pColl_00;
  Mem *pFrom;
  void *pvVar3;
  sqlite3 *psVar4;
  Mem *in_RDX;
  sqlite3_context *in_RDI;
  CollSeq *pColl;
  int cmp;
  int max;
  Mem *pBest;
  Mem *pArg;
  Mem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  FuncDef *pVal;
  
  pVal = (in_RDX->u).pDef;
  pColl_00 = (CollSeq *)sqlite3_aggregate_context((sqlite3_context *)in_stack_ffffffffffffffc8,0);
  if (pColl_00 != (CollSeq *)0x0) {
    iVar1 = sqlite3_value_type((sqlite3_value *)pVal);
    if (iVar1 == 5) {
      if (*(short *)&pColl_00->enc != 0) {
        sqlite3SkipAccumulatorLoad(in_RDI);
      }
    }
    else if (*(short *)&pColl_00->enc == 0) {
      psVar4 = sqlite3_context_db_handle(in_RDI);
      pColl_00[1].zName = (char *)psVar4;
      sqlite3VdbeMemCopy((Mem *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
    }
    else {
      pFrom = (Mem *)sqlite3GetFuncCollSeq(in_RDI);
      pvVar3 = sqlite3_user_data(in_RDI);
      uVar2 = (uint)(pvVar3 != (void *)0x0);
      iVar1 = sqlite3MemCompare(in_RDX,(Mem *)pVal,pColl_00);
      if (((uVar2 == 0) || (-1 < iVar1)) && ((uVar2 != 0 || (iVar1 < 1)))) {
        sqlite3SkipAccumulatorLoad(in_RDI);
      }
      else {
        sqlite3VdbeMemCopy((Mem *)CONCAT44(uVar2,iVar1),pFrom);
      }
    }
  }
  return;
}

Assistant:

static void minmaxStep(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **argv
){
  Mem *pArg  = (Mem *)argv[0];
  Mem *pBest;
  UNUSED_PARAMETER(NotUsed);

  pBest = (Mem *)sqlite3_aggregate_context(context, sizeof(*pBest));
  if( !pBest ) return;

  if( sqlite3_value_type(pArg)==SQLITE_NULL ){
    if( pBest->flags ) sqlite3SkipAccumulatorLoad(context);
  }else if( pBest->flags ){
    int max;
    int cmp;
    CollSeq *pColl = sqlite3GetFuncCollSeq(context);
    /* This step function is used for both the min() and max() aggregates,
    ** the only difference between the two being that the sense of the
    ** comparison is inverted. For the max() aggregate, the
    ** sqlite3_user_data() function returns (void *)-1. For min() it
    ** returns (void *)db, where db is the sqlite3* database pointer.
    ** Therefore the next statement sets variable 'max' to 1 for the max()
    ** aggregate, or 0 for min().
    */
    max = sqlite3_user_data(context)!=0;
    cmp = sqlite3MemCompare(pBest, pArg, pColl);
    if( (max && cmp<0) || (!max && cmp>0) ){
      sqlite3VdbeMemCopy(pBest, pArg);
    }else{
      sqlite3SkipAccumulatorLoad(context);
    }
  }else{
    pBest->db = sqlite3_context_db_handle(context);
    sqlite3VdbeMemCopy(pBest, pArg);
  }
}